

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::max_cover_lazy_budget_fast_end
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double *timeb,int mode)

{
  pointer pvVar1;
  pointer *ppuVar2;
  size_t sVar3;
  pointer pvVar4;
  size_type *psVar5;
  size_type sVar6;
  uint *puVar7;
  pointer pdVar8;
  pointer puVar9;
  pointer ppVar10;
  pointer ppVar11;
  uint uVar12;
  ulong uVar14;
  ostream *poVar15;
  _Bit_type *p_Var16;
  undefined8 extraout_RAX;
  pointer puVar17;
  undefined8 extraout_RAX_00;
  uint *puVar18;
  pointer pvVar19;
  long lVar20;
  pointer *ppuVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  size_t degBound;
  ulong uVar25;
  double *pdVar26;
  double dVar27;
  long lVar28;
  size_type *psVar29;
  long lVar30;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  long lVar31;
  long lVar32;
  long lVar33;
  pointer ppVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  Nodelist *pNVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined4 uVar50;
  double dVar49;
  reference rVar51;
  double local_2a8;
  double local_2a0;
  undefined4 local_294;
  value_type argmaxIdx_1;
  uint local_28c;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  vecNodeLastPair;
  double local_268;
  undefined8 local_258;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  double local_228;
  Nodelist *local_220;
  int local_214;
  vector<double,_std::allocator<double>_> coverage_cost;
  RRsets degMap_cost;
  long local_1c8;
  ulong local_1b8;
  RRsets missMap_cost;
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  Timer timerBound;
  long local_110;
  RRsets degMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> miss_nodes_vec;
  FRset coverage;
  vector<bool,_std::allocator<bool>_> edgeMark;
  vector<bool,_std::allocator<bool>_> node_sel;
  uint uVar13;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_214 = mode;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&coverage,(ulong)this->__numV,(value_type_conflict2 *)&edgeMark,
             (allocator_type *)&node_sel);
  uVar14 = (ulong)this->__numV;
  ppuVar21 = (pointer *)
             ((long)&(this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  dVar39 = 0.0;
  while (bVar35 = uVar14 != 0, uVar14 = uVar14 - 1, bVar35) {
    uVar25 = (long)*ppuVar21 - (long)((_Vector_impl_data *)(ppuVar21 + -1))->_M_start >> 3;
    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14] = uVar25;
    if ((ulong)dVar39 < uVar25) {
      dVar39 = (double)uVar25;
    }
    ppuVar21 = ppuVar21 + -3;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&degMap,(long)dVar39 + 1,(allocator_type *)&edgeMark);
  uVar13 = this->__numV;
  while( true ) {
    uVar12 = uVar13 - 1;
    edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
    if (uVar13 == 0) break;
    uVar13 = uVar12;
    if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12],(value_type_conflict *)&edgeMark);
      uVar13 = (uint)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
  }
  node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark,this->__numRRsets,(bool *)&node_sel,(allocator_type *)&edgeMark_cost);
  edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00)
  ;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&node_sel,(ulong)this->__numV,(bool *)&edgeMark_cost,(allocator_type *)&node_sel_cost);
  dVar37 = min_vector_nonzero_mask(budget_list,&node_sel);
  std::operator<<((ostream *)&std::cout,"min_cost: ");
  poVar15 = std::ostream::_M_insert<double>(dVar37);
  std::endl<char,std::char_traits<char>>(poVar15);
  puVar17 = (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17;
  }
  local_220 = &this->__vecSeed_inf;
  iVar23 = 0;
  local_268 = 0.0;
  while( true ) {
    if ((budget < dVar37) || (dVar39 == 0.0)) break;
    pvVar1 = degMap.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)dVar39;
    lVar31 = (long)degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar39].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar39].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    local_228 = (double)((long)dVar39 - 1);
    while (bVar35 = lVar31 != 0, lVar31 = lVar31 + -1, bVar35) {
      node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._0_4_ =
           (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar31];
      if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start
          [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] < (ulong)dVar39) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p],
                   (value_type_conflict *)&node_sel_cost);
      }
      else {
        if ((budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start
            [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] <= budget) {
          if (local_214 == 2) {
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
            edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            timerBound.__StartTime.__d.__r._0_4_ =
                 (int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [degMap.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar39].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar31]];
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&edgeMark_cost,
                       (uint *)&timerBound);
            lVar20 = 0;
            for (p_Var16 = edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var16 !=
                (_Bit_type *)
                edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
                p_Var16 = (_Bit_type *)((long)p_Var16 + 4)) {
              lVar20 = lVar20 + (ulong)(uint)*p_Var16;
            }
            lVar20 = lVar20 + (long)local_268;
            auVar42._8_4_ = (int)((ulong)lVar20 >> 0x20);
            auVar42._0_8_ = lVar20;
            auVar42._12_4_ = 0x45300000;
            sVar3 = this->__numRRsets;
            auVar44._8_4_ = (int)(sVar3 >> 0x20);
            auVar44._0_8_ = sVar3;
            auVar44._12_4_ = 0x45300000;
            dVar38 = ((double)this->__numV *
                     ((auVar42._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0))) /
                     ((auVar44._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
            this->__boundLast_inf = dVar38;
            if (dVar38 < this->__boundMin_inf) {
              this->__boundMin_inf = dVar38;
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&edgeMark_cost);
          }
          if (iVar23 == 0) {
            local_268 = (double)((long)local_268 +
                                coverage.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p]);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (local_220,(value_type_conflict *)&node_sel_cost);
            uVar14 = (ulong)(uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] = 0;
            pvVar4 = (this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar5 = *(pointer *)
                      ((long)&pvVar4[uVar14].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + 8);
            for (psVar29 = pvVar4[uVar14].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; psVar29 != psVar5;
                psVar29 = psVar29 + 1) {
              sVar6 = *psVar29;
              rVar51 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,sVar6);
              if ((*rVar51._M_p & rVar51._M_mask) == 0) {
                rVar51 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark,sVar6);
                *rVar51._M_p = *rVar51._M_p | rVar51._M_mask;
                pvVar19 = (this->__hyperG)._RRsets.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar7 = *(pointer *)
                          ((long)&pvVar19[sVar6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                for (puVar18 = pvVar19[sVar6].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar18 != puVar7;
                    puVar18 = puVar18 + 1) {
                  if (coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[*puVar18] != 0) {
                    coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[*puVar18] =
                         coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar18] - 1;
                  }
                }
              }
            }
          }
          iVar23 = iVar23 + 1;
        }
        if (iVar23 == 2) goto LAB_00106b52;
      }
    }
    if (iVar23 == 2) break;
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         degMap.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&(degMap.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    dVar39 = local_228;
  }
LAB_00106b52:
  uVar13 = this->__numV;
  sVar3 = this->__numRRsets;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar15 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::operator<<(poVar15," ");
  uVar50 = SUB164(ZEXT816(0x4530000043300000),4);
  uVar48 = SUB164(ZEXT816(0x4530000043300000),0);
  local_258._0_4_ = (undefined4)sVar3;
  local_258._4_4_ = (undefined4)(sVar3 >> 0x20);
  dVar39 = ((double)uVar13 *
           (((double)CONCAT44(uVar50,(int)((ulong)local_268 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar48,SUB84(local_268,0)) - 4503599627370496.0))) /
           (((double)CONCAT44(uVar50,local_258._4_4_) - 1.9342813113834067e+25) +
           ((double)CONCAT44(uVar48,(undefined4)local_258) - 4503599627370496.0));
  poVar15 = std::ostream::_M_insert<double>(dVar39);
  std::operator<<(poVar15,", min-bound: ");
  poVar15 = std::ostream::_M_insert<double>(this->__boundMin_inf);
  std::operator<<(poVar15,", last-bound: ");
  poVar15 = std::ostream::_M_insert<double>(this->__boundLast_inf);
  std::operator<<(poVar15,'\n');
  edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&coverage_cost,(ulong)this->__numV,(value_type_conflict4 *)&edgeMark_cost,
             (allocator_type *)&node_sel_cost);
  uVar14 = (ulong)this->__numV;
  pdVar8 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppuVar21 = (pointer *)
             ((long)&(this->__hyperG)._FRsets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14 - 1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  local_220 = (Nodelist *)0x0;
  local_268 = 1.79769313486232e+308;
  while (bVar35 = uVar14 != 0, uVar14 = uVar14 - 1, bVar35) {
    dVar37 = pdVar8[uVar14];
    bVar35 = 1e-10 < ABS(dVar37);
    lVar31 = (long)*ppuVar21 - (long)((_Vector_impl_data *)(ppuVar21 + -1))->_M_start;
    auVar47._8_4_ = (int)(lVar31 >> 0x23);
    auVar47._0_8_ = lVar31 >> 3;
    auVar47._12_4_ = 0x45300000;
    dVar37 = ((auVar47._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)(lVar31 >> 3)) - 4503599627370496.0)) / dVar37;
    dVar38 = dVar37;
    if (lVar31 == 0 || !bVar35) {
      dVar38 = 0.0;
    }
    coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14] = dVar38;
    dVar49 = local_268;
    if (lVar31 != 0 && bVar35) {
      uVar25 = -(ulong)(1e-10 < ABS(dVar37));
      dVar49 = (double)(~uVar25 & (ulong)local_268 | uVar25 & (ulong)dVar38);
    }
    pNVar40 = (Nodelist *)dVar38;
    if (dVar38 <= (double)local_220) {
      pNVar40 = local_220;
    }
    local_268 = (double)(~-(ulong)(dVar38 < local_268) & (ulong)local_268 |
                        (ulong)dVar49 & -(ulong)(dVar38 < local_268));
    ppuVar21 = ppuVar21 + -3;
    local_220 = pNVar40;
  }
  std::operator<<((ostream *)&std::cout,"minDeg_cost: ");
  poVar15 = std::ostream::_M_insert<double>(local_268);
  std::endl<char,std::char_traits<char>>(poVar15);
  dVar37 = 1.0 - epsilon;
  local_268 = local_268 * dVar37;
  local_110 = 0x18;
  lVar31 = -1;
  for (pNVar40 = local_220; local_268 <= (double)pNVar40;
      pNVar40 = (Nodelist *)((double)pNVar40 * dVar37)) {
    local_110 = local_110 + -0x18;
    lVar31 = lVar31 + 1;
  }
  sVar6 = lVar31 + 1;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&degMap_cost,sVar6,(allocator_type *)&edgeMark_cost);
  poVar15 = std::operator<<((ostream *)&std::cout,"maxIdx_cost: ");
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::endl<char,std::char_traits<char>>(poVar15);
  lVar20 = -lVar31;
  for (pNVar40 = local_220; local_268 <= (double)pNVar40;
      pNVar40 = (Nodelist *)((double)pNVar40 * dVar37)) {
    uVar13 = this->__numV;
    while( true ) {
      uVar12 = uVar13 - 1;
      edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar12);
      if (uVar13 == 0) break;
      uVar13 = uVar12;
      if (((double)pNVar40 <=
           coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12]) &&
         (coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] <= (double)pNVar40 / dVar37)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (degMap_cost.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar31,
                   (value_type_conflict *)&edgeMark_cost);
        uVar13 = (uint)edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      }
    }
    bVar35 = lVar31 == 0;
    lVar31 = lVar31 + -1;
    if (bVar35) break;
  }
  miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&missMap_cost,sVar6,(allocator_type *)&edgeMark_cost);
  node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p._0_4_ =
       (uint)node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&edgeMark_cost,this->__numRRsets,(bool *)&node_sel_cost,(allocator_type *)&timerBound);
  timerBound.__StartTime.__d.__r =
       (duration)((ulong)timerBound.__StartTime.__d.__r & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&node_sel_cost,(ulong)this->__numV,(bool *)&timerBound,(allocator_type *)&local_248);
  local_2a0 = min_vector_nonzero_mask(budget_list,&node_sel_cost);
  timerBound.__StartTime.__d.__r = (duration)0;
  timerBound.__LastTime.__d.__r = (duration)0;
  timerBound.__EndTime.__d.__r = (duration)0;
  timerBound.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  timerBound.__processName = "Bound";
  puVar17 = (this->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar17) {
    (this->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar17;
  }
  local_1c8 = ((long)degMap_cost.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)degMap_cost.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_228 = 0.0;
  local_1b8 = 0;
  timerBound.__LastTime.__d.__r = timerBound.__StartTime.__d.__r;
  timerBound.__EndTime.__d.__r = timerBound.__StartTime.__d.__r;
  do {
    bVar35 = local_1c8 == 0;
    local_1c8 = local_1c8 + -1;
    if ((bVar35) || (budget < local_228 + local_2a0)) {
      uVar13 = this->__numV;
      sVar3 = this->__numRRsets;
      poVar15 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::operator<<(poVar15," ");
      local_258._0_4_ = (undefined4)sVar3;
      local_258._4_4_ = (undefined4)(sVar3 >> 0x20);
      local_258 = ((double)uVar13 *
                  (((double)CONCAT44(0x45300000,(int)(local_1b8 >> 0x20)) - 1.9342813113834067e+25)
                  + ((double)CONCAT44(0x43300000,(int)local_1b8) - 4503599627370496.0))) /
                  (((double)CONCAT44(0x45300000,local_258._4_4_) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(undefined4)local_258) - 4503599627370496.0));
      poVar15 = std::ostream::_M_insert<double>(local_258);
      std::operator<<(poVar15,", min-bound_cost: ");
      poVar15 = std::ostream::_M_insert<double>(this->__boundMin_inf_cost);
      std::operator<<(poVar15,", last-bound_cost: ");
      poVar15 = std::ostream::_M_insert<double>(this->__boundLast_inf_cost);
      std::operator<<(poVar15,'\n');
      puVar17 = (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (dVar39 <= local_258) {
        if (puVar9 != puVar17) {
          (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar17;
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                   (this->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar15 = std::operator<<((ostream *)&std::cout,"Cost Inf: ");
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        bVar35 = true;
        std::endl<char,std::char_traits<char>>(poVar15);
      }
      else {
        if (puVar9 != puVar17) {
          (this->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar17;
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                   (this->__vecSeed_inf).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->__vecSeed_inf).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar15 = std::operator<<((ostream *)&std::cout,"Inf: ");
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::endl<char,std::char_traits<char>>(poVar15);
        bVar35 = false;
        local_258 = dVar39;
      }
      this->__is_inf_cost = bVar35;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&node_sel_cost.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&missMap_cost);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&degMap_cost);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&coverage_cost.super__Vector_base<double,_std::allocator<double>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&node_sel.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&edgeMark.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&degMap);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return local_258;
    }
    pvVar1 = degMap_cost.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_1c8;
    pvVar19 = degMap_cost.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar31 = (long)degMap_cost.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)degMap_cost.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    do {
      if (lVar31 == 0) break;
      argmaxIdx_1 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar31 + -1];
      puVar18 = (uint *)(ulong)argmaxIdx_1;
      dVar38 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)puVar18];
      dVar49 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)puVar18];
      if (local_228 + dVar49 <= budget) {
        if ((local_214 == 2) || ((local_214 == 1 && (budget < local_228 + dVar49 + local_2a0)))) {
          Timer::get_operation_time(&timerBound);
          local_248._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
          local_248._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
          local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar24 = (long)miss_nodes_vec.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)miss_nodes_vec.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
LAB_0010719a:
          bVar35 = lVar24 != 0;
          lVar24 = lVar24 + -1;
          lVar32 = local_110;
          lVar30 = lVar20;
          pNVar40 = local_220;
          if (bVar35) {
            for (; local_268 <= (double)pNVar40; pNVar40 = (Nodelist *)((double)pNVar40 * dVar37)) {
              if (((double)pNVar40 <=
                   coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar24]]) &&
                 (coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [miss_nodes_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar24]] <= (double)pNVar40 / dVar37)) {
                vecNodeLastPair.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     miss_nodes_vec.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24];
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ((long)missMap_cost.
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - lVar32),
                           (uint *)&vecNodeLastPair);
                break;
              }
              if (lVar30 == 0) break;
              lVar32 = lVar32 + 0x18;
              lVar30 = lVar30 + 1;
            }
            goto LAB_0010719a;
          }
          lVar30 = (long)missMap_cost.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)missMap_cost.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          lVar32 = 0;
          lVar24 = lVar31;
          for (dVar49 = 0.0; bVar35 = true, local_2a0 + dVar49 <= budget;
              dVar49 = dVar49 + (budget_list->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [degMap_cost.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar28]]) {
            if (lVar24 == 0) {
              local_28c = 0;
              lVar24 = -1;
              lVar32 = lVar31;
              goto LAB_0010734b;
            }
            uVar13 = degMap_cost.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24 + -1];
            dVar27 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            if (budget < dVar49 + dVar27) {
              vecNodeLastPair.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (undefined4)
                   (long)((budget - dVar49) *
                         coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13]);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                         (uint *)&vecNodeLastPair);
              lVar24 = lVar24 + -1;
              local_28c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              bVar35 = false;
              dVar49 = budget;
              goto LAB_0010734b;
            }
            vecNodeLastPair.
            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                 (undefined4)
                 (long)(dVar27 * coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar13]);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                       (uint *)&vecNodeLastPair);
            lVar28 = lVar24 + -1;
            lVar32 = lVar32 + 1;
            lVar24 = lVar24 + -1;
          }
          local_28c = 0;
LAB_0010734b:
          lVar28 = lVar32 + lVar30;
          while ((lVar33 = lVar32, lVar22 = local_1c8, local_2a0 + dVar49 <= budget &&
                 (bVar36 = lVar30 != 0, lVar30 = lVar30 + -1, lVar33 = lVar28, bVar36))) {
            uVar13 = missMap_cost.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar30];
            dVar27 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            if (budget < dVar49 + dVar27) {
              vecNodeLastPair.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (undefined4)
                   (long)((budget - dVar49) *
                         coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13]);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                         (uint *)&vecNodeLastPair);
              lVar33 = lVar32;
              dVar49 = budget;
              goto LAB_001076a2;
            }
            vecNodeLastPair.
            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                 (undefined4)
                 (long)(dVar27 * coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar13]);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                       (uint *)&vecNodeLastPair);
            dVar49 = dVar49 + (budget_list->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [missMap_cost.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_1c8].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar30]];
            lVar32 = lVar32 + 1;
          }
          local_2a8 = 0.0;
          if (bVar35) {
            while (dVar27 = dVar49, dVar49 = dVar27, local_2a0 + dVar27 <= budget) {
              lVar22 = lVar22 + -1;
              if (lVar22 == 0) {
                lVar22 = 0;
                break;
              }
              puVar17 = degMap_cost.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar30 = (long)degMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar17 >> 2;
              lVar28 = (long)missMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)missMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              lVar32 = 0;
              lVar24 = lVar30;
              for (; local_2a0 + dVar49 <= budget;
                  dVar49 = dVar49 + (budget_list->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start[puVar17[lVar33]]) {
                if (lVar24 == 0) {
                  lVar24 = -1;
                  lVar32 = lVar30;
                  break;
                }
                uVar13 = puVar17[lVar24 + -1];
                dVar41 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                if (budget < dVar49 + dVar41) {
                  vecNodeLastPair.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                       (undefined4)
                       (long)((budget - dVar49) *
                             coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar13]);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                             (uint *)&vecNodeLastPair);
                  lVar24 = lVar24 + -1;
                  local_28c = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                  dVar49 = budget;
                  break;
                }
                vecNodeLastPair.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     (long)(dVar41 * coverage_cost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar13]);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                           (uint *)&vecNodeLastPair);
                puVar17 = degMap_cost.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar22].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar33 = lVar24 + -1;
                lVar32 = lVar32 + 1;
                lVar24 = lVar24 + -1;
              }
              lVar30 = lVar32 + lVar28;
              while ((lVar33 = lVar32, local_2a8 = dVar27, local_2a0 + dVar49 <= budget &&
                     (bVar35 = lVar28 != 0, lVar28 = lVar28 + -1, lVar33 = lVar30, bVar35))) {
                uVar13 = missMap_cost.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar22].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28];
                dVar41 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
                if (budget < dVar49 + dVar41) {
                  vecNodeLastPair.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                       (undefined4)
                       (long)((budget - dVar49) *
                             coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar13]);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                             (uint *)&vecNodeLastPair);
                  lVar33 = lVar32;
                  dVar49 = budget;
                  goto LAB_001076eb;
                }
                vecNodeLastPair.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     (long)(dVar41 * coverage_cost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar13]);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                           (uint *)&vecNodeLastPair);
                dVar49 = dVar49 + (budget_list->super__Vector_base<double,_std::allocator<double>_>)
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [missMap_cost.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar22].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar28]];
                lVar32 = lVar32 + 1;
              }
              uVar13 = local_28c & 1;
              local_28c = 0;
              if (uVar13 != 0) break;
            }
          }
          else {
LAB_001076a2:
            local_2a8 = 0.0;
          }
LAB_001076eb:
          if ((lVar33 == 0) || (lVar24 == 0)) {
            if ((dVar49 < budget) && (lVar24 == 0)) {
              lVar22 = lVar22 + -1;
              puVar17 = degMap_cost.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar24 = (long)degMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar17 >> 2;
              dVar27 = 0.0;
              while (dVar41 = dVar27, bVar35 = lVar24 != 0, lVar24 = lVar24 + -1, bVar35) {
                dVar27 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[puVar17[lVar24]];
                if (coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[puVar17[lVar24]] <= dVar41) {
                  dVar27 = dVar41;
                }
              }
              puVar17 = missMap_cost.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar22].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar24 = (long)missMap_cost.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar17 >> 2;
              while (dVar27 = dVar41, bVar35 = lVar24 != 0, lVar24 = lVar24 + -1, bVar35) {
                dVar41 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[puVar17[lVar24]];
                if (coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[puVar17[lVar24]] <= dVar27) {
                  dVar41 = dVar27;
                }
              }
              vecNodeLastPair.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (undefined4)(long)((budget - dVar49) * dVar27);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                         (uint *)&vecNodeLastPair);
            }
          }
          else {
            local_248._M_impl.super__Vector_impl_data._M_finish =
                 local_248._M_impl.super__Vector_impl_data._M_finish + -lVar33;
            std::
            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ::vector(&vecNodeLastPair,
                     ((long)missMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)missMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) +
                     ((long)degMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)degMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2),(allocator_type *)&local_294);
            ppVar11 = vecNodeLastPair.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            puVar17 = degMap_cost.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar22].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar24 = (long)degMap_cost.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar22].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar17;
            lVar32 = lVar24 >> 2;
            pdVar26 = (double *)
                      (CONCAT44(vecNodeLastPair.
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                vecNodeLastPair.
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar24 * 4 + -8);
            while (bVar35 = lVar32 != 0, lVar32 = lVar32 + -1, bVar35) {
              dVar27 = (double)(ulong)puVar17[lVar32];
              dVar49 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)dVar27];
              pdVar26[-1] = dVar27;
              *pdVar26 = dVar49;
              pdVar26 = pdVar26 + -2;
            }
            puVar17 = missMap_cost.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar22].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar32 = (long)missMap_cost.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar22].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar17;
            lVar30 = lVar32 >> 2;
            pdVar26 = (double *)
                      (lVar24 * 4 + lVar32 * 4 +
                       CONCAT44(vecNodeLastPair.
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                vecNodeLastPair.
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8);
            while (bVar35 = lVar30 != 0, lVar30 = lVar30 + -1, bVar35) {
              dVar27 = (double)(ulong)puVar17[lVar30];
              dVar49 = coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)dVar27];
              pdVar26[-1] = dVar27;
              *pdVar26 = dVar49;
              pdVar26 = pdVar26 + -2;
            }
            ppVar10 = (pointer)CONCAT44(vecNodeLastPair.
                                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        vecNodeLastPair.
                                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
            if (ppVar10 !=
                vecNodeLastPair.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar32 = (long)vecNodeLastPair.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10;
              uVar14 = lVar32 >> 4;
              lVar24 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar24 == 0; lVar24 = lVar24 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                        (ppVar10,vecNodeLastPair.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                         ((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar32 < 0x101) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                          (ppVar10,ppVar11);
              }
              else {
                ppVar34 = ppVar10 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                          (ppVar10,ppVar34);
                for (; ppVar34 != ppVar11; ppVar34 = ppVar34 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Val_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                            (ppVar34);
                }
              }
            }
            lVar24 = ((long)missMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)missMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) +
                     ((long)degMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)degMap_cost.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
            lVar32 = lVar24 * 0x10;
            while ((lVar32 = lVar32 + -0x10, local_2a0 + local_2a8 <= budget &&
                   (bVar35 = lVar24 != 0, lVar24 = lVar24 + -1, bVar35))) {
              lVar30 = *(long *)(CONCAT44(vecNodeLastPair.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          vecNodeLastPair.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar32)
              ;
              dVar49 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar30];
              if (local_2a8 + dVar49 <= budget) {
                local_294 = (undefined4)
                            (long)(dVar49 * coverage_cost.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[lVar30]);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                           (uint *)&local_294);
                local_2a8 = local_2a8 +
                            (budget_list->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start
                            [*(long *)(CONCAT44(vecNodeLastPair.
                                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                vecNodeLastPair.
                                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      lVar32)];
              }
              else {
                local_294 = (undefined4)
                            (long)((budget - local_2a8) *
                                  coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar30]);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,
                           (uint *)&local_294);
                local_2a8 = budget;
              }
            }
            std::
            _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ::~_Vector_base(&vecNodeLastPair.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           );
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_248._M_impl.super__Vector_impl_data._M_start,
                     local_248._M_impl.super__Vector_impl_data._M_finish);
          make_min_heap((Nodelist *)&local_248);
          lVar24 = 0;
          for (puVar17 = local_248._M_impl.super__Vector_impl_data._M_start;
              puVar17 != local_248._M_impl.super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1)
          {
            lVar24 = lVar24 + (ulong)*puVar17;
          }
          lVar24 = lVar24 + local_1b8;
          uVar50 = SUB164(ZEXT816(0x4530000043300000),4);
          auVar43._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar43._0_8_ = lVar24;
          auVar43._12_4_ = uVar50;
          uVar48 = SUB164(ZEXT816(0x4530000043300000),0);
          sVar3 = this->__numRRsets;
          auVar45._8_4_ = (int)(sVar3 >> 0x20);
          auVar45._0_8_ = sVar3;
          auVar45._12_4_ = uVar50;
          dVar49 = ((double)this->__numV *
                   ((auVar43._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar48,(int)lVar24) - 4503599627370496.0))) /
                   ((auVar45._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(uVar48,(int)sVar3) - 4503599627370496.0));
          this->__boundLast_inf_cost = dVar49;
          if (dVar49 < this->__boundMin_inf_cost) {
            this->__boundMin_inf_cost = dVar49;
          }
          dVar49 = Timer::get_operation_time(&timerBound);
          *timeb = dVar49 + *timeb;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_248);
          dVar49 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[argmaxIdx_1];
        }
        auVar46._0_8_ = (double)CONCAT44(0x43300000,(int)local_1b8);
        auVar46._8_4_ = (int)(local_1b8 >> 0x20);
        auVar46._12_4_ = 0x45300000;
        dVar38 = dVar38 * dVar49 +
                 (auVar46._8_8_ - 1.9342813113834067e+25) + (auVar46._0_8_ - 4503599627370496.0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->__vecSeed_inf_cost,&argmaxIdx_1);
        uVar14 = (ulong)argmaxIdx_1;
        local_228 = local_228 +
                    (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar14];
        coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar14] = 0.0;
        rVar51 = std::vector<bool,_std::allocator<bool>_>::operator[](&node_sel_cost,uVar14);
        *rVar51._M_p = *rVar51._M_p | rVar51._M_mask;
        local_2a0 = min_vector_nonzero_mask(budget_list,&node_sel_cost);
        local_1b8 = (ulong)dVar38;
        local_1b8 = (long)(dVar38 - 9.223372036854776e+18) & (long)local_1b8 >> 0x3f | local_1b8;
        pvVar4 = (this->__hyperG)._FRsets.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = *(pointer *)
                  ((long)&pvVar4[argmaxIdx_1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (psVar29 = pvVar4[argmaxIdx_1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pvVar19 = degMap_cost.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, psVar29 != psVar5;
            psVar29 = psVar29 + 1) {
          sVar6 = *psVar29;
          rVar51 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark_cost,sVar6);
          if ((*rVar51._M_p & rVar51._M_mask) == 0) {
            rVar51 = std::vector<bool,_std::allocator<bool>_>::operator[](&edgeMark_cost,sVar6);
            *rVar51._M_p = *rVar51._M_p | rVar51._M_mask;
            pvVar19 = (this->__hyperG)._RRsets.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar7 = *(pointer *)
                      ((long)&pvVar19[sVar6].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8);
            pdVar8 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            for (puVar18 = pvVar19[sVar6].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; puVar18 != puVar7;
                puVar18 = puVar18 + 1) {
              uVar13 = *puVar18;
              if (1e-10 < ABS(coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar13])) {
                dVar38 = pdVar8[uVar13];
                coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13] =
                     (double)(~-(ulong)(ABS(dVar38) < 1e-10) &
                             (ulong)((coverage_cost.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar13] * dVar38 + -1.0) /
                                    dVar38));
              }
            }
          }
        }
      }
      else if (1e-10 < ABS(dVar38)) {
        local_248._M_impl.super__Vector_impl_data._M_start = puVar18;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&miss_nodes_vec,(unsigned_long *)&local_248);
        pvVar19 = degMap_cost.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      ppuVar2 = &pvVar19[local_1c8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
      lVar31 = lVar31 + -1;
    } while (local_228 + local_2a0 <= budget);
    degMap_cost.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         degMap_cost.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&(degMap_cost.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  } while( true );
}

Assistant:

double Alg::max_cover_lazy_budget_fast_end(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, const double epsilon, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    double maxDeg_cost = 0;
    double minDeg_cost = DBL_MAX;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
        if (coverage_cost[i] > maxDeg_cost) {
            maxDeg_cost = coverage_cost[i];
        }
        if (coverage_cost[i] < minDeg_cost) {
            if (fabs(coverage_cost[i]) > EPS) {
                minDeg_cost = coverage_cost[i];
            }
        }
    }
    std::cout << "minDeg_cost: " <<  minDeg_cost << std::endl;

    size_t maxIdx_cost = 0;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        maxIdx_cost++;
    }

    // initial reverse index
    RRsets degMap_cost(maxIdx_cost); // degMap: map degree threshold to the nodes over this threshold
    std::cout << "maxIdx_cost: " << maxIdx_cost << std::endl;
    size_t tmpidx_cost = maxIdx_cost - 1;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        for (auto i = __numV; i--; ) {
            if (coverage_cost[i] >= deg_thr && coverage_cost[i] <= deg_thr / (1 - epsilon)) {
                degMap_cost[tmpidx_cost].push_back(i);
            }
        }
        if (tmpidx_cost == 0) {
            break;
        }
        tmpidx_cost--;
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // miss nodes
    std::vector<size_t> miss_nodes_vec;
    RRsets missMap_cost(maxIdx_cost);
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t degidx = degMap_cost.size(); degidx--; ) {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        auto & vecNode = degMap_cost[degidx];
        for (size_t idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const double currDeg = coverage_cost[argmaxIdx];
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2 || (mode == 1 && sumBudget_cost + budget_list[argmaxIdx] + min_cost > budget)) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = degidx;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    size_t lastNum = 0;
                    double vecBound_Budget_Last = 0;
                    bool is_stop = false;
                    size_t tmp_miss_idx_cost = 0;
                    for (auto miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        tmp_miss_idx_cost = maxIdx_cost - 1;
                        for (double miss_deg_thr = maxDeg_cost;
                                miss_deg_thr >= minDeg_cost * (1 - epsilon); miss_deg_thr = miss_deg_thr * (1 - epsilon)) {
                            if (coverage_cost[miss_nodes_vec[miss_idx]] >= miss_deg_thr &&
                                    coverage_cost[miss_nodes_vec[miss_idx]] <= miss_deg_thr / (1 - epsilon)) {
                                missMap_cost[tmp_miss_idx_cost].push_back(miss_nodes_vec[miss_idx]);
                                break;
                            }
                            if (tmp_miss_idx_cost == 0) {
                                break;
                            }
                            tmp_miss_idx_cost--;
                        }
                    }
                    auto miss_idxBound = missMap_cost[degBound].size();
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   budget_list[degMap_cost[degBound][idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                        while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                            if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   budget_list[missMap_cost[degBound][miss_idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            lastNum = 0;
                            vecBound_Budget_Last = vecBound_Budget;
                            idxBound = degMap_cost[degBound].size();
                            miss_idxBound = missMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       budget_list[degMap_cost[degBound][idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                                if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       budget_list[missMap_cost[degBound][miss_idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    // roll back
                    if (lastNum != 0 && idxBound != 0) {
                        while (lastNum) {
                            vecBound.pop_back();
                            lastNum = lastNum - 1;
                        }
                        vecBound_Budget = vecBound_Budget_Last;
                        std::vector<std::pair<size_t, double>> vecNodeLastPair(degMap_cost[degBound].size()
                            + missMap_cost[degBound].size());
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            vecNodeLastPair[idxpair] = std::make_pair(degMap_cost[degBound][idxpair],
                                                                      coverage_cost[degMap_cost[degBound][idxpair]]);
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ){
                            vecNodeLastPair[miss_idxpair + degMap_cost[degBound].size()] =
                                    std::make_pair(missMap_cost[degBound][miss_idxpair],
                                            coverage_cost[missMap_cost[degBound][miss_idxpair]]);
                        }
                        std::sort(vecNodeLastPair.begin(), vecNodeLastPair.end(), [](auto & left, auto & right){
                            return std::get<1>(left) < std::get<1>(right);
                        });
                        // choose max
                        idxBound = degMap_cost[degBound].size() + missMap_cost[degBound].size();
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])] <= budget) {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   budget_list[std::get<0>(vecNodeLastPair[idxBound])]);
                                vecBound_Budget = vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])];
                            }
                            else {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   (budget- vecBound_Budget));
                                vecBound_Budget = budget;
                            }
                        }
                    }
                    else if (idxBound == 0 && vecBound_Budget < budget) {
                        double max_coverage_ratio = 0.0;
                        degBound = degBound - 1;
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            if (coverage_cost[degMap_cost[degBound][idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[degMap_cost[degBound][idxpair]];
                            }
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ) {
                            if (coverage_cost[missMap_cost[degBound][miss_idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[missMap_cost[degBound][miss_idxpair]];
                            }
                        }
                        vecBound.push_back(max_coverage_ratio * (budget- vecBound_Budget));
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);
                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + currDeg * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (fabs(coverage_cost[nodeIdx]) <= EPS) {
                            continue; // This node is seed, skip
                        }
                        if (fabs(budget_list[nodeIdx]) >= EPS) {
                            coverage_cost[nodeIdx] = (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                     budget_list[nodeIdx];
                        } else {
                            coverage_cost[nodeIdx] = 0;
                        }
                    }
                }
                degMap_cost[degidx].pop_back();
            }
            else {
                if (fabs(coverage_cost[argmaxIdx]) > EPS) {
                    miss_nodes_vec.push_back(argmaxIdx);
//                    std::cout << "miss node size: " << miss_nodes_vec.size() << std::endl;
                }
                degMap_cost[degidx].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}